

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_binary(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *__format;
  uint32_t len;
  uint8_t *binary;
  bson_subtype_t subtype;
  bson_t b;
  bson_error_t error;
  undefined8 uVar7;
  uint local_394;
  char *local_390;
  uint local_384;
  undefined1 local_380 [208];
  uint local_2b0;
  uint local_2ac;
  char local_2a8 [640];
  
  cVar1 = bson_init_from_json(local_380,
                              "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
                              0xffffffffffffffff,&local_2b0);
  if (cVar1 == '\0') {
    uVar3 = 0x4aa;
LAB_00122dd2:
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            uVar3,"test_bson_json_read_binary","r",local_2a8);
    fflush(_stderr);
    abort();
  }
  uVar3 = bson_bcone_magic();
  bcon_extract(local_380,"b",uVar3,4,&local_384,&local_390,&local_394,0);
  pcVar4 = local_390;
  uVar6 = (ulong)local_384;
  if (local_384 == 5) {
    uVar6 = (ulong)local_394;
    if (local_394 == 3) {
      if ((local_390 != "foo") && (iVar2 = strcmp(local_390,"foo"), iVar2 != 0)) {
        __format = "FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n";
        pcVar5 = "foo";
        local_390 = pcVar4;
        goto LAB_00122f91;
      }
      bson_destroy(local_380);
      cVar1 = bson_init_from_json(local_380,
                                  "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                  ,0xffffffffffffffff,&local_2b0);
      if (cVar1 == '\0') {
        uVar3 = 0x4b8;
        goto LAB_00122dd2;
      }
      bcon_extract(local_380,"b",uVar3,4,&local_384,&local_390,&local_394,0);
      uVar6 = (ulong)local_384;
      if (local_384 == 5) {
        uVar6 = (ulong)local_394;
        if (local_394 == 3) {
          if ((local_390 != "foo") && (iVar2 = strcmp(local_390,"foo"), iVar2 != 0)) {
            __format = "FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n";
            pcVar5 = "foo";
            goto LAB_00122f91;
          }
          bson_destroy(local_380);
          cVar1 = bson_init_from_json(local_380,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                      0xffffffffffffffff,&local_2b0);
          if (cVar1 != '\0') {
            uVar3 = 0x4c3;
LAB_00122ce3:
            fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                    ,uVar3,"test_bson_json_read_binary","!r");
            abort();
          }
          if (local_2b0 == 1) {
            if (local_2ac == 2) {
              pcVar4 = strstr(local_2a8,"Missing \"base64\" after \"subType\"");
              local_390 = local_2a8;
              if (pcVar4 == (char *)0x0) {
                __format = "FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n";
                pcVar5 = "Missing \"base64\" after \"subType\"";
LAB_00122f91:
                fprintf(_stderr,__format,local_390,pcVar5);
                abort();
              }
              cVar1 = bson_init_from_json(local_380,"{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}"
                                          ,0xffffffffffffffff,&local_2b0);
              if (cVar1 != '\0') {
                uVar3 = 0x4cc;
                goto LAB_00122ce3;
              }
              if (local_2b0 == 1) {
                if (local_2ac == 2) {
                  pcVar4 = strstr(local_2a8,"Missing \"subType\" after \"base64\"");
                  if (pcVar4 != (char *)0x0) {
                    return;
                  }
                  __format = "FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n";
                  pcVar5 = "Missing \"subType\" after \"base64\"";
                  goto LAB_00122f91;
                }
                uVar3 = 2;
              }
              else {
                uVar3 = 1;
                local_2ac = local_2b0;
              }
              uVar6 = (ulong)local_2ac;
              pcVar4 = "FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n";
              uVar7 = 0x4d0;
              goto LAB_00122f33;
            }
            uVar3 = 2;
          }
          else {
            uVar3 = 1;
            local_2ac = local_2b0;
          }
          uVar6 = (ulong)local_2ac;
          pcVar4 = "FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n";
          uVar7 = 0x4c7;
        }
        else {
          pcVar4 = "FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n";
          uVar3 = 3;
          uVar7 = 0x4bb;
        }
      }
      else {
        pcVar4 = "FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n";
        uVar3 = 5;
        uVar7 = 0x4ba;
      }
    }
    else {
      pcVar4 = "FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n";
      uVar3 = 3;
      uVar7 = 0x4ae;
    }
  }
  else {
    pcVar4 = "FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n";
    uVar3 = 5;
    uVar7 = 0x4ad;
  }
LAB_00122f33:
  fprintf(_stderr,pcVar4,uVar6,"==",uVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar7,"test_bson_json_read_binary");
  abort();
}

Assistant:

static void
test_bson_json_read_binary (void)
{
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   r = bson_init_from_json (
      &b,
      "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
      -1,
      &error);
   ASSERT_OR_PRINT (r, error);

   BCON_EXTRACT (&b, "b", BCONE_BIN (subtype, binary, len));
   ASSERT_CMPINT ((int) subtype, ==, 5);
   ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
   ASSERT_CMPSTR ((const char *) binary, "foo");

   bson_destroy (&b);

   r = bson_init_from_json (
      &b,
      "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}",
      -1,
      &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "b", BCONE_BIN (subtype, binary, len));
   ASSERT_CMPINT ((int) subtype, ==, 5);
   ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
   ASSERT_CMPSTR ((const char *) binary, "foo");

   bson_destroy (&b);

   /* no base64 */
   r = bson_init_from_json (
      &b, "{\"b\": {\"$binary\": {\"subType\": \"5\"}}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"base64\" after \"subType\"");

   /* no subType */
   r = bson_init_from_json (
      &b, "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"subType\" after \"base64\"");
}